

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

char * nni_http_reason(nng_http_status code)

{
  long lVar1;
  anon_struct_16_2_3ef68a38 *paVar2;
  long lVar3;
  
  if (code == NNG_HTTP_STATUS_OK) {
    paVar2 = nni_http_reason::http_status;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x3a0) {
        return "Unknown HTTP Status";
      }
      lVar1 = lVar3 + 0x10;
    } while (*(nng_http_status *)((long)&nni_http_reason::http_status[1].code + lVar3) != code);
    paVar2 = (anon_struct_16_2_3ef68a38 *)(lVar3 + 0x153530);
  }
  return paVar2->mesg;
}

Assistant:

const char *
nni_http_reason(nng_http_status code)
{
	static struct {
		nng_http_status code;
		const char     *mesg;
	} http_status[] = {
		// 200, listed first because most likely
		{ NNG_HTTP_STATUS_OK, "OK" },

		// 100 series -- informational
		{ NNG_HTTP_STATUS_CONTINUE, "Continue" },
		{ NNG_HTTP_STATUS_SWITCHING, "Switching Protocols" },
		{ NNG_HTTP_STATUS_PROCESSING, "Processing" },

		// 200 series -- successful
		{ NNG_HTTP_STATUS_CREATED, "Created" },
		{ NNG_HTTP_STATUS_ACCEPTED, "Accepted" },
		{ NNG_HTTP_STATUS_NOT_AUTHORITATIVE, "Not Authoritative" },
		{ NNG_HTTP_STATUS_NO_CONTENT, "No Content" },
		{ NNG_HTTP_STATUS_RESET_CONTENT, "Reset Content" },
		{ NNG_HTTP_STATUS_PARTIAL_CONTENT, "Partial Content" },
		{ NNG_HTTP_STATUS_MULTI_STATUS, "Multi-Status" },
		{ NNG_HTTP_STATUS_ALREADY_REPORTED, "Already Reported" },
		{ NNG_HTTP_STATUS_IM_USED, "IM Used" },

		// 300 series -- redirection
		{ NNG_HTTP_STATUS_MULTIPLE_CHOICES, "Multiple Choices" },
		{ NNG_HTTP_STATUS_STATUS_MOVED_PERMANENTLY,
		    "Moved Permanently" },
		{ NNG_HTTP_STATUS_FOUND, "Found" },
		{ NNG_HTTP_STATUS_SEE_OTHER, "See Other" },
		{ NNG_HTTP_STATUS_NOT_MODIFIED, "Not Modified" },
		{ NNG_HTTP_STATUS_USE_PROXY, "Use Proxy" },
		{ NNG_HTTP_STATUS_TEMPORARY_REDIRECT, "Temporary Redirect" },
		{ NNG_HTTP_STATUS_PERMANENT_REDIRECT, "Permanent Redirect" },

		// 400 series -- client errors
		{ NNG_HTTP_STATUS_BAD_REQUEST, "Bad Request" },
		{ NNG_HTTP_STATUS_UNAUTHORIZED, "Unauthorized" },
		{ NNG_HTTP_STATUS_PAYMENT_REQUIRED, "Payment Required" },
		{ NNG_HTTP_STATUS_FORBIDDEN, "Forbidden" },
		{ NNG_HTTP_STATUS_NOT_FOUND, "Not Found" },
		{ NNG_HTTP_STATUS_METHOD_NOT_ALLOWED, "Method Not Allowed" },
		{ NNG_HTTP_STATUS_NOT_ACCEPTABLE, "Not Acceptable" },
		{ NNG_HTTP_STATUS_PROXY_AUTH_REQUIRED,
		    "Proxy Authentication Required" },
		{ NNG_HTTP_STATUS_REQUEST_TIMEOUT, "Request Timeout" },
		{ NNG_HTTP_STATUS_CONFLICT, "Conflict" },
		{ NNG_HTTP_STATUS_GONE, "Gone" },
		{ NNG_HTTP_STATUS_LENGTH_REQUIRED, "Length Required" },
		{ NNG_HTTP_STATUS_PRECONDITION_FAILED, "Precondition Failed" },
		{ NNG_HTTP_STATUS_CONTENT_TOO_LARGE, "Content Too Large" },
		{ NNG_HTTP_STATUS_URI_TOO_LONG, "URI Too Long" },
		{ NNG_HTTP_STATUS_UNSUPPORTED_MEDIA_TYPE,
		    "Unsupported Media Type" },
		{ NNG_HTTP_STATUS_RANGE_NOT_SATISFIABLE,
		    "Range Not Satisfiable" },
		{ NNG_HTTP_STATUS_EXPECTATION_FAILED, "Expectation Failed" },
		{ NNG_HTTP_STATUS_TEAPOT, "I Am A Teapot" },
		{ NNG_HTTP_STATUS_LOCKED, "Locked" },
		{ NNG_HTTP_STATUS_FAILED_DEPENDENCY, "Failed Dependency" },
		{ NNG_HTTP_STATUS_UPGRADE_REQUIRED, "Upgrade Required" },
		{ NNG_HTTP_STATUS_PRECONDITION_REQUIRED,
		    "Precondition Required" },
		{ NNG_HTTP_STATUS_TOO_MANY_REQUESTS, "Too Many Requests" },
		{ NNG_HTTP_STATUS_HEADERS_TOO_LARGE, "Headers Too Large" },
		{ NNG_HTTP_STATUS_UNAVAIL_LEGAL_REASONS,
		    "Unavailable For Legal Reasons" },

		// 500 series -- server errors
		{ NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR,
		    "Internal Server Error" },
		{ NNG_HTTP_STATUS_NOT_IMPLEMENTED, "Not Implemented" },
		{ NNG_HTTP_STATUS_BAD_REQUEST, "Bad Gateway" },
		{ NNG_HTTP_STATUS_SERVICE_UNAVAILABLE, "Service Unavailable" },
		{ NNG_HTTP_STATUS_GATEWAY_TIMEOUT, "Gateway Timeout" },
		{ NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP,
		    "HTTP Version Not Supported" },
		{ NNG_HTTP_STATUS_VARIANT_ALSO_NEGOTIATES,
		    "Variant Also Negotiates" },
		{ NNG_HTTP_STATUS_INSUFFICIENT_STORAGE,
		    "Insufficient Storage" },
		{ NNG_HTTP_STATUS_LOOP_DETECTED, "Loop Detected" },
		{ NNG_HTTP_STATUS_NOT_EXTENDED, "Not Extended" },
		{ NNG_HTTP_STATUS_NETWORK_AUTH_REQUIRED,
		    "Network Authentication Required" },

		// Terminator
		{ 0, NULL },
	};

	for (int i = 0; http_status[i].code != 0; i++) {
		if (http_status[i].code == code) {
			return (http_status[i].mesg);
		}
	}
	return ("Unknown HTTP Status");
}